

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

QSize __thiscall QTreeView::viewportSizeHint(QTreeView *this)

{
  QTreeViewPrivate *this_00;
  QWidgetData *pQVar1;
  iterator iVar2;
  QSize QVar3;
  int iVar4;
  ulong uVar5;
  QRect QVar6;
  
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
     ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
    QAbstractItemViewPrivate::interruptDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate);
    (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8 + 0x220))();
  }
  if ((this_00->viewItems).d.size != 0) {
    iVar2 = QList<QTreeViewItem>::end(&this_00->viewItems);
    QVar6 = QTreeViewPrivate::visualRect(this_00,&iVar2.i[-1].index,SingleSection);
    if (QVar6.x1.m_i.m_i <= QVar6.x2.m_i.m_i && QVar6.y1.m_i.m_i <= QVar6.y2.m_i.m_i) {
      QVar3.wd.m_i = QHeaderView::length(this_00->header);
      QVar3.ht.m_i = 0;
      pQVar1 = (this_00->header->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
               super_QWidget.data;
      iVar4 = 0;
      if ((pQVar1->widget_attributes & 0x10000) == 0) {
        iVar4 = ((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i) + 1;
      }
      uVar5 = (ulong)(uint)(QVar6.y2.m_i.m_i + 1 + iVar4);
      goto LAB_005a6e41;
    }
  }
  QVar3 = QAbstractItemView::viewportSizeHint((QAbstractItemView *)this);
  uVar5 = (ulong)QVar3 >> 0x20;
LAB_005a6e41:
  return (QSize)((ulong)QVar3 & 0xffffffff | uVar5 << 0x20);
}

Assistant:

QSize QTreeView::viewportSizeHint() const
{
    Q_D(const QTreeView);
    d->executePostedLayout(); // Make sure that viewItems are up to date.

    if (d->viewItems.size() == 0)
        return QAbstractItemView::viewportSizeHint();

    // Get rect for last item
    const QRect deepestRect = d->visualRect(d->viewItems.last().index,
                                            QTreeViewPrivate::SingleSection);

    if (!deepestRect.isValid())
        return QAbstractItemView::viewportSizeHint();

    QSize result = QSize(d->header->length(), deepestRect.bottom() + 1);

    // add size for header
    result += QSize(0, d->header->isHidden() ? 0 : d->header->height());

    return result;
}